

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O3

void absl::StrAppend(Nonnull<std::string_*> dest,AlphaNum *a,AlphaNum *b)

{
  size_t sVar1;
  size_t sVar2;
  pointer pcVar3;
  size_t __n;
  size_t __n_00;
  ulong uVar4;
  pointer __dest;
  
  sVar1 = (a->piece_)._M_len;
  if ((sVar1 != 0) &&
     ((ulong)((long)(a->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length))
  {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xc6,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = (b->piece_)._M_len;
  if (sVar2 == 0) {
    uVar4 = dest->_M_string_length;
  }
  else {
    uVar4 = dest->_M_string_length;
    if ((ulong)((long)(b->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= uVar4) {
      __assert_fail("((b).size() == 0) || (uintptr_t((b).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                    ,199,
                    "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &)"
                   );
    }
  }
  std::__cxx11::string::_M_replace_aux((ulong)dest,uVar4,0,(char)sVar2 + (char)sVar1);
  pcVar3 = (dest->_M_dataplus)._M_p;
  __dest = pcVar3 + uVar4;
  __n = (a->piece_)._M_len;
  if (__n != 0) {
    memcpy(__dest,(a->piece_)._M_str,__n);
  }
  __n_00 = (b->piece_)._M_len;
  if (__n_00 != 0) {
    memcpy(__dest + __n,(b->piece_)._M_str,__n_00);
  }
  if (__dest + __n + __n_00 == pcVar3 + dest->_M_string_length) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0xce,
                "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

void StrAppend(absl::Nonnull<std::string*> dest, const AlphaNum& a,
               const AlphaNum& b) {
  ASSERT_NO_OVERLAP(*dest, a);
  ASSERT_NO_OVERLAP(*dest, b);
  std::string::size_type old_size = dest->size();
  STLStringAppendUninitializedAmortized(dest, a.size() + b.size());
  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  out = Append(out, a);
  out = Append(out, b);
  assert(out == begin + dest->size());
}